

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# respondent.c
# Opt level: O1

int nn_respondent_create(void *hint,nn_sockbase **sockbase)

{
  nn_xrespondent *self;
  
  self = (nn_xrespondent *)nn_alloc_(0x1d8);
  if (self != (nn_xrespondent *)0x0) {
    nn_xrespondent_init(self,&nn_respondent_sockbase_vfptr,hint);
    *(undefined4 *)&self[1].sockbase.vfptr = 0;
    *sockbase = (nn_sockbase *)self;
    return 0;
  }
  nn_respondent_create_cold_1();
}

Assistant:

static int nn_respondent_create (void *hint, struct nn_sockbase **sockbase)
{
    struct nn_respondent *self;

    self = nn_alloc (sizeof (struct nn_respondent), "socket (respondent)");
    alloc_assert (self);
    nn_respondent_init (self, &nn_respondent_sockbase_vfptr, hint);
    *sockbase = &self->xrespondent.sockbase;

    return 0;
}